

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O0

UChar * ucharstrenum_unext(UEnumeration *en,int32_t *resultLength,UErrorCode *param_3)

{
  int iVar1;
  void *pvVar2;
  int32_t iVar3;
  UChar *result;
  UCharStringEnumeration *e;
  UErrorCode *param_2_local;
  int32_t *resultLength_local;
  UEnumeration *en_local;
  
  if (*(int *)&en[1].baseContext < *(int *)((long)&en[1].baseContext + 4)) {
    pvVar2 = en->context;
    iVar1 = *(int *)&en[1].baseContext;
    *(int *)&en[1].baseContext = iVar1 + 1;
    en_local = *(UEnumeration **)((long)pvVar2 + (long)iVar1 * 8);
    if (resultLength != (int32_t *)0x0) {
      iVar3 = u_strlen_63((UChar *)en_local);
      *resultLength = iVar3;
    }
  }
  else {
    en_local = (UEnumeration *)0x0;
  }
  return (UChar *)en_local;
}

Assistant:

static const UChar* U_CALLCONV
ucharstrenum_unext(UEnumeration* en,
                  int32_t* resultLength,
                  UErrorCode* /*ec*/) {
    UCharStringEnumeration *e = (UCharStringEnumeration*) en;
    if (e->index >= e->count) {
        return NULL;
    }
    const UChar* result = ((const UChar**)e->uenum.context)[e->index++];
    if (resultLength) {
        *resultLength = (int32_t)u_strlen(result);
    }
    return result;
}